

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator>::WriteVectorInternal<true>
          (StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  int iVar1;
  idx_t i;
  Allocator *pAVar2;
  long lVar3;
  idx_t iVar4;
  idx_t iVar5;
  primitive_dictionary_entry_t *ppVar6;
  InternalException *this_00;
  NumericStatisticsState<int,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  ValidityMask *mask;
  idx_t r;
  Vector *pVVar7;
  int target_value;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_00258197_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar7 = *(Vector **)(input_column + 0x20);
  mask = (ValidityMask *)(input_column + 0x28);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)mask == 0) {
      TemplatedWritePlain<int,int,duckdb::ParquetCastOperator,true>
                (pVVar7,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<int,int,duckdb::ParquetCastOperator,false>
              (pVVar7,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_00258197_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar5 = iVar4, (*(ulong *)(*(long *)mask + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0
           )) {
          iVar1 = *(int *)(pVVar7 + iVar5 * 4);
          if (iVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar1;
          }
          local_58[0] = (undefined1 *)(long)iVar1;
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar1) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar1;
          }
          DbpEncoder::BeginWriteInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar5 + 1;
          goto LAB_002584b3;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_002584b3:
      if (chunk_start < chunk_end) {
        do {
          iVar1 = *(int *)(pVVar7 + chunk_start * 4);
          if (iVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar1;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar1) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar1;
          }
          local_58[0] = (undefined1 *)(long)iVar1;
          DbpEncoder::WriteValueInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar5 = iVar4, (*(ulong *)(*(long *)mask + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0
           )) {
          iVar1 = *(int *)(pVVar7 + iVar5 * 4);
          local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,iVar1);
          if (iVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar1;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar1) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar1;
          }
          pAVar2 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<int>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar2,temp_writer,(int *)local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar5 + 1;
          goto LAB_002583af;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_002583af:
      if (chunk_start < chunk_end) {
        do {
          iVar1 = *(int *)(pVVar7 + chunk_start * 4);
          local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,iVar1);
          if (iVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar1;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar1) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar1;
          }
          DlbaEncoder::WriteValue<int>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(int *)local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar4 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar5 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar4 = iVar5, (*(ulong *)(*(long *)mask + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) != 0
           )) {
          local_58[0] = (undefined1 *)
                        CONCAT71(local_58[0]._1_7_,
                                 *(undefined1 *)
                                  ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_00258431;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_00258431:
      lVar3 = chunk_end - iVar4;
      if (iVar4 <= chunk_end && lVar3 != 0) {
        pVVar7 = pVVar7 + iVar4 * 4;
        do {
          ppVar6 = PrimitiveDictionary<int,_int,_duckdb::ParquetCastOperator>::Lookup
                             ((PrimitiveDictionary<int,_int,_duckdb::ParquetCastOperator> *)
                              page_state_p[0x121b]._vptr_ColumnWriterPageState,(int *)pVVar7);
          local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,ppVar6->index);
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)local_58);
          pVVar7 = pVVar7 + 4;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar2 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar2);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        iVar1 = *(int *)(pVVar7 + chunk_start * 4);
        local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,iVar1);
        if (iVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
          *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar1;
        }
        if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar1) {
          *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar1;
        }
        lVar3 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar3 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)local_58 + lVar3);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}